

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O2

void __thiscall
kratos::DependencyVisitor::visit_module_instantiation
          (DependencyVisitor *this,ModuleInstantiationStmt *stmt)

{
  size_type *psVar1;
  undefined1 local_50 [8];
  unordered_set<kratos::AssignStmt_*,_std::hash<kratos::AssignStmt_*>,_std::equal_to<kratos::AssignStmt_*>,_std::allocator<kratos::AssignStmt_*>_>
  connection_stmts;
  
  std::
  _Hashtable<kratos::AssignStmt_*,_kratos::AssignStmt_*,_std::allocator<kratos::AssignStmt_*>,_std::__detail::_Identity,_std::equal_to<kratos::AssignStmt_*>,_std::hash<kratos::AssignStmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_Hashtable((_Hashtable<kratos::AssignStmt_*,_kratos::AssignStmt_*,_std::allocator<kratos::AssignStmt_*>,_std::__detail::_Identity,_std::equal_to<kratos::AssignStmt_*>,_std::hash<kratos::AssignStmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                *)local_50,&(stmt->super_InstantiationStmt).connection_stmt_._M_h);
  psVar1 = &connection_stmts._M_h._M_bucket_count;
  while (psVar1 = (size_type *)*psVar1, psVar1 != (size_type *)0x0) {
    visit_assign(this,(AssignStmt *)((__node_base *)(psVar1 + 1))->_M_nxt);
  }
  std::
  _Hashtable<kratos::AssignStmt_*,_kratos::AssignStmt_*,_std::allocator<kratos::AssignStmt_*>,_std::__detail::_Identity,_std::equal_to<kratos::AssignStmt_*>,_std::hash<kratos::AssignStmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::AssignStmt_*,_kratos::AssignStmt_*,_std::allocator<kratos::AssignStmt_*>,_std::__detail::_Identity,_std::equal_to<kratos::AssignStmt_*>,_std::hash<kratos::AssignStmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_50);
  return;
}

Assistant:

void visit_module_instantiation(ModuleInstantiationStmt *stmt) {
        auto connection_stmts = stmt->connection_stmt();
        for (auto const &assign : connection_stmts) {
            visit_assign(assign);
        }
    }